

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall
ON_Layer::CullPerViewportSettings(ON_Layer *this,int viewport_id_count,ON_UUID *viewport_id_list)

{
  bool bVar1;
  ON__LayerExtensions *this_00;
  ON__LayerPerViewSettings *pOVar2;
  int iVar3;
  undefined8 local_40;
  ON_UUID vp_id;
  int j;
  int i;
  ON__LayerExtensions *ud;
  ON_UUID *viewport_id_list_local;
  int viewport_id_count_local;
  ON_Layer *this_local;
  
  this_00 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
  if (this_00 != (ON__LayerExtensions *)0x0) {
    if (viewport_id_count < 1) {
      ON__LayerExtensions::DeleteViewportSettings
                (this,&this->m_extension_bits,(ON__LayerPerViewSettings *)0x0);
    }
    else if ((0 < viewport_id_count) && (viewport_id_list != (ON_UUID *)0x0)) {
      vp_id.Data4._4_4_ = ON_SimpleArray<ON__LayerPerViewSettings>::Count(&this_00->m_vp_settings);
      while (iVar3 = vp_id.Data4._4_4_ + -1, vp_id.Data4._4_4_ != 0) {
        vp_id.Data4._4_4_ = iVar3;
        pOVar2 = ON_SimpleArray<ON__LayerPerViewSettings>::operator[](&this_00->m_vp_settings,iVar3)
        ;
        local_40._0_4_ = (pOVar2->m_viewport_id).Data1;
        local_40._4_2_ = (pOVar2->m_viewport_id).Data2;
        local_40._6_2_ = (pOVar2->m_viewport_id).Data3;
        vp_id._0_8_ = *(undefined8 *)(pOVar2->m_viewport_id).Data4;
        vp_id.Data4[0] = '\0';
        vp_id.Data4[1] = '\0';
        vp_id.Data4[2] = '\0';
        vp_id.Data4[3] = '\0';
        while (((int)vp_id.Data4._0_4_ < viewport_id_count &&
               (iVar3 = memcmp(viewport_id_list + (int)vp_id.Data4._4_4_,&local_40,0x10), iVar3 != 0
               ))) {
          vp_id.Data4._0_4_ = vp_id.Data4._0_4_ + 1;
        }
        if (viewport_id_count <= (int)vp_id.Data4._0_4_) {
          ON_SimpleArray<ON__LayerPerViewSettings>::Remove
                    (&this_00->m_vp_settings,vp_id.Data4._4_4_);
        }
      }
      vp_id.Data4._4_4_ = iVar3;
      bVar1 = ON__LayerExtensions::IsEmpty(this_00);
      if (bVar1) {
        ON__LayerExtensions::DeleteViewportSettings
                  (this,&this->m_extension_bits,(ON__LayerPerViewSettings *)0x0);
      }
    }
  }
  return;
}

Assistant:

void ON_Layer::CullPerViewportSettings( int viewport_id_count, const ON_UUID* viewport_id_list )
{
  ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
  if ( 0 != ud )
  {
    if ( viewport_id_count <= 0 )
    {
      // delete all per viewport settings
      ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
      ud = 0;
    }
    else if ( viewport_id_count > 0 && 0 != viewport_id_list )
    {
      int i, j;
      for ( i = ud->m_vp_settings.Count(); i--; /*empty iterator*/ )
      {
        const ON_UUID vp_id = ud->m_vp_settings[i].m_viewport_id;
        for ( j = 0; j < viewport_id_count; j++ )
        {
          if ( 0 == memcmp(&viewport_id_list[i],&vp_id,sizeof(vp_id)) )
            break;
        }
        if ( j >= viewport_id_count )
        {
          // ud->m_vp_settings[i].m_viewport_id is NOT in viewport_id_list[]
          ud->m_vp_settings.Remove(i);
        }
      }
      if ( ud->IsEmpty() )
      {
        // nothing useful in ud
        ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
        ud = 0;
      }
    }
  }
}